

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  Module *this_00;
  pointer pFVar1;
  Location local_118;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_f8;
  Location local_f0;
  Var local_d0;
  string local_88;
  string local_68;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_48;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  this_local = (BinaryReaderIR *)field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
  super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::FuncImport>();
  string_view::to_string_abi_cxx11_(&local_68,(string_view *)&field_name_local.size_);
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar1->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.module_name,
             (string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  string_view::to_string_abi_cxx11_(&local_88,(string_view *)&this_local);
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar1->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.field_name,
             (string *)&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     (&local_48);
  GetLocation(&local_f0,this);
  Var::Var(&local_d0,sig_index,&local_f0);
  SetFuncDeclaration(this,&(pFVar1->func).decl,&local_d0);
  Var::~Var(&local_d0);
  this_00 = this->module_;
  GetLocation(&local_118,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
            ((wabt *)&local_f8,&local_48,&local_118);
  Module::AppendField(this_00,&local_f8);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_f8);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr(&local_48);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    string_view module_name,
                                    string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = MakeUnique<FuncImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  SetFuncDeclaration(&import->func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}